

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

uint __thiscall llvm::APInt::countLeadingZerosSlowCase(APInt *this)

{
  uint uVar1;
  size_t sVar2;
  int local_34;
  uint Mod;
  uint64_t V;
  int i;
  uint Count;
  APInt *this_local;
  
  V._4_4_ = 0;
  V._0_4_ = getNumWords(this);
  do {
    V._0_4_ = (uint)V - 1;
    if ((int)(uint)V < 0) {
LAB_001bb1ea:
      uVar1 = this->BitWidth & 0x3f;
      if (uVar1 == 0) {
        local_34 = 0;
      }
      else {
        local_34 = 0x40 - uVar1;
      }
      return V._4_4_ - local_34;
    }
    if ((this->U).pVal[(int)(uint)V] != 0) {
      sVar2 = countLeadingZeros<unsigned_long>((this->U).pVal[(int)(uint)V],ZB_Width);
      V._4_4_ = V._4_4_ + (int)sVar2;
      goto LAB_001bb1ea;
    }
    V._4_4_ = V._4_4_ + 0x40;
  } while( true );
}

Assistant:

unsigned APInt::countLeadingZerosSlowCase() const {
  unsigned Count = 0;
  for (int i = getNumWords()-1; i >= 0; --i) {
    uint64_t V = U.pVal[i];
    if (V == 0)
      Count += APINT_BITS_PER_WORD;
    else {
      Count += llvm::countLeadingZeros(V);
      break;
    }
  }
  // Adjust for unused bits in the most significant word (they are zero).
  unsigned Mod = BitWidth % APINT_BITS_PER_WORD;
  Count -= Mod > 0 ? APINT_BITS_PER_WORD - Mod : 0;
  return Count;
}